

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O3

int lddmc_member_cube_copy(MDD a,uint32_t *values,int *copy,size_t count)

{
  llmsset_t plVar1;
  size_t sVar2;
  
  plVar1 = nodes;
  sVar2 = 0;
  while( true ) {
    if (a == 0) {
      return 0;
    }
    if (a == 1) break;
    if (count == sVar2) {
      __assert_fail("count > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_ldd.c"
                    ,0x749,"int lddmc_member_cube_copy(MDD, uint32_t *, int *, size_t)");
    }
    if (*copy == 0) {
      a = lddmc_follow(a,values[sVar2]);
    }
    else {
      a = *(ulong *)(plVar1->data + a * 0x10 + 8) >> 0x11 &
          (long)(*(ulong *)(plVar1->data + a * 0x10 + 8) << 0x2f) >> 0x3f;
    }
    sVar2 = sVar2 + 1;
  }
  return 1;
}

Assistant:

int
lddmc_member_cube_copy(MDD a, uint32_t* values, int* copy, size_t count)
{
    while (1) {
        if (a == lddmc_false) return 0;
        if (a == lddmc_true) return 1;
        if (count <= 0) assert(count > 0); // size mismatch

        if (*copy) a = lddmc_followcopy(a);
        else a = lddmc_follow(a, *values);
        values++;
        count--;
    }
}